

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O2

void __thiscall QDebug::putByteArray(QDebug *this,char *begin,size_t length,Latin1Content content)

{
  byte bVar1;
  QTextStreamPrivate *this_00;
  int iVar2;
  undefined4 in_register_0000000c;
  ulong __n;
  uint uVar3;
  size_t sVar4;
  bool bVar5;
  long in_FS_OFFSET;
  void *pvStack_80;
  QDebugStateSaver saver;
  undefined2 local_5a;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  __n = CONCAT44(in_register_0000000c,content);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->stream->noQuotes == true) {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    if (content == ContainsLatin1) {
      QString::fromLatin1((QString *)&local_58,(QString *)begin,(char *)length,__n);
    }
    else {
      QString::fromUtf8((QString *)&local_58,(QString *)begin,(char *)length,__n);
    }
    QTextStreamPrivate::putString
              ((this->stream->ts).d_ptr._M_t.
               super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>.
               _M_t.
               super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
               .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl,
               (QChar *)local_58.ptr,local_58.size,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  else {
    saver.d._M_t.
    super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>.
    _M_t.
    super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>
    .super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
         (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
         &DAT_aaaaaaaaaaaaaaaa;
    QDebugStateSaver::QDebugStateSaver(&saver,this);
    QTextStreamPrivate::Params::reset
              (&((this->stream->ts).d_ptr._M_t.
                 super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
                 .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl)->params);
    this_00 = (this->stream->ts).d_ptr._M_t.
              super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>.
              _M_t.
              super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
              .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
    local_5a = 0x22;
    QTextStreamPrivate::write(this_00,(int)&local_5a,(void *)0x1,__n);
    bVar5 = false;
    for (sVar4 = 0; length != sVar4; sVar4 = sVar4 + 1) {
      if (bVar5) {
        iVar2 = QtMiscUtils::fromHex((uint)(byte)begin[sVar4]);
        if (iVar2 != -1) {
          local_58.d._0_4_ = CONCAT22(local_5a,local_5a);
          QTextStreamPrivate::write(this_00,(int)&local_58,(void *)0x2,__n);
        }
      }
      bVar1 = begin[sVar4];
      __n = (ulong)bVar1;
      if (((bVar1 - 0x20 < 0x5f) && (bVar1 != 0x22)) && (bVar1 != 0x5c)) {
        local_58.d = (Data *)CONCAT62(local_58.d._2_6_,(ushort)bVar1);
        QTextStreamPrivate::write(this_00,(int)&local_58,(void *)0x1,__n);
        bVar5 = false;
      }
      else {
        local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.size = CONCAT44(local_58.size._4_4_,0xaaaaaaaa);
        uVar3 = bVar1 - 8;
        if (5 < uVar3) {
          if ((bVar1 != 0x5c) && (bVar1 != 0x22)) goto switchD_0020fd9c_caseD_b;
          local_58.d._0_4_ = (uint)CONCAT12(bVar1,0x5c);
          local_58.d = (Data *)CONCAT44(0xaaaaaaaa,(uint)local_58.d);
          goto LAB_0020fe36;
        }
        __n = (long)&switchD_0020fd9c::switchdataD_00465188 +
              (long)(int)(&switchD_0020fd9c::switchdataD_00465188)[uVar3];
        switch((uint)bVar1) {
        case 8:
          local_58.d = (Data *)0xaaaaaaaa0062005c;
          break;
        case 9:
          local_58.d = (Data *)0xaaaaaaaa0074005c;
          break;
        case 10:
          local_58.d = (Data *)0xaaaaaaaa006e005c;
          break;
        case 0xb:
switchD_0020fd9c_caseD_b:
          if (content == ContainsLatin1) {
            local_58.d = (Data *)0x3000300075005c;
            __n = (ulong)(uint)(int)"0123456789ABCDEF"[bVar1 >> 4];
            local_58.ptr = (char16_t *)
                           CONCAT44(0xaaaaaaaa,
                                    CONCAT22((short)"0123456789ABCDEF"[bVar1 & 0xf],
                                             (short)"0123456789ABCDEF"[bVar1 >> 4]));
            bVar5 = false;
            pvStack_80 = (void *)0x6;
          }
          else {
            __n = (ulong)(uint)(int)"0123456789ABCDEF"[bVar1 >> 4];
            local_58.d = (Data *)CONCAT26((short)"0123456789ABCDEF"[bVar1 & 0xf],
                                          CONCAT24((short)"0123456789ABCDEF"[bVar1 >> 4],0x78005c));
            bVar5 = true;
            pvStack_80 = (void *)0x4;
          }
          goto LAB_0020fe3b;
        case 0xc:
          local_58.d = (Data *)0xaaaaaaaa0066005c;
          break;
        case 0xd:
          local_58.d = (Data *)0xaaaaaaaa0072005c;
        }
LAB_0020fe36:
        bVar5 = false;
        pvStack_80 = (void *)0x2;
LAB_0020fe3b:
        QTextStreamPrivate::write(this_00,(int)&local_58,pvStack_80,__n);
      }
    }
    QTextStreamPrivate::write(this_00,(int)&local_5a,(void *)0x1,__n);
    QDebugStateSaver::~QDebugStateSaver(&saver);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDebug::putByteArray(const char *begin, size_t length, Latin1Content content)
{
    if (stream->noQuotes) {
        // no quotes, write the string directly too (no pretty-printing)
        // this respects the QTextStream state, though
        QString string = content == ContainsLatin1 ? QString::fromLatin1(begin, qsizetype(length))
                                                   : QString::fromUtf8(begin, qsizetype(length));
        stream->ts.d_ptr->putString(string);
    } else {
        // we'll reset the QTextStream formatting mechanisms, so save the state
        QDebugStateSaver saver(*this);
        stream->ts.d_ptr->params.reset();
        putEscapedString(stream->ts.d_ptr.get(), reinterpret_cast<const uchar *>(begin),
                         length, content == ContainsLatin1);
    }
}